

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterClose(xmlTextWriterPtr writer)

{
  int local_1c;
  int result;
  xmlTextWriterPtr writer_local;
  
  if ((writer == (xmlTextWriterPtr)0x0) || (writer->out == (xmlOutputBufferPtr)0x0)) {
    writer_local._4_4_ = 0x73;
  }
  else {
    local_1c = xmlOutputBufferClose(writer->out);
    writer->out = (xmlOutputBufferPtr)0x0;
    if (local_1c < 0) {
      local_1c = -local_1c;
    }
    else {
      local_1c = 0;
    }
    writer_local._4_4_ = local_1c;
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterClose(xmlTextWriterPtr writer)
{
    int result;

    if ((writer == NULL) || (writer->out == NULL))
        return XML_ERR_ARGUMENT;

    result = xmlOutputBufferClose(writer->out);
    writer->out = NULL;

    if (result >= 0)
        result = XML_ERR_OK;
    else
        result = -result;

    return result;
}